

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void Cmd_clear(FCommandLine *argv,APlayerPawn *who,int key)

{
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  C_FlushDisplay();
  ClearConsole();
  return;
}

Assistant:

CCMD (clear)
{
	C_FlushDisplay ();
	ClearConsole ();
}